

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  ulong uVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  StackItemT<embree::NodeRefPtr<4>_> SVar11;
  StackItemT<embree::NodeRefPtr<4>_> SVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar34;
  uint uVar35;
  int iVar36;
  undefined4 uVar37;
  long lVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar45;
  long lVar46;
  ulong unaff_R13;
  size_t mask;
  Scene *scene;
  ulong uVar47;
  float fVar48;
  float fVar56;
  float fVar57;
  vint4 bi_1;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar58;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  float fVar88;
  float fVar93;
  undefined1 auVar89 [16];
  float fVar91;
  float fVar92;
  undefined1 auVar90 [64];
  uint uVar95;
  uint uVar96;
  uint uVar97;
  undefined1 auVar94 [64];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined8 local_1218;
  undefined8 uStack_1210;
  vbool<4> valid;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  Geometry *local_11b0;
  ulong local_11a8;
  undefined8 *local_11a0;
  ulong local_1198;
  ulong local_1190;
  RTCFilterFunctionNArguments args;
  undefined8 local_1158;
  undefined8 uStack_1150;
  vfloat<4> tNear;
  float local_10e8 [4];
  float local_10d8 [4];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined1 local_1088 [16];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar45 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar37 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1028._4_4_ = uVar37;
  local_1028._0_4_ = uVar37;
  local_1028._8_4_ = uVar37;
  local_1028._12_4_ = uVar37;
  auVar87 = ZEXT1664(local_1028);
  uVar37 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1038._4_4_ = uVar37;
  local_1038._0_4_ = uVar37;
  local_1038._8_4_ = uVar37;
  local_1038._12_4_ = uVar37;
  auVar90 = ZEXT1664(local_1038);
  uVar37 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1048._4_4_ = uVar37;
  local_1048._0_4_ = uVar37;
  local_1048._8_4_ = uVar37;
  local_1048._12_4_ = uVar37;
  auVar94 = ZEXT1664(local_1048);
  local_1058 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1068 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1078 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1198 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar47 = local_1198 ^ 0x10;
  local_1190 = uVar41 ^ 0x10;
  iVar36 = (tray->tfar).field_0.i[k];
  auVar55 = ZEXT1664(CONCAT412(iVar36,CONCAT48(iVar36,CONCAT44(iVar36,iVar36))));
  iVar36 = (tray->tnear).field_0.i[k];
  local_1088._4_4_ = iVar36;
  local_1088._0_4_ = iVar36;
  local_1088._8_4_ = iVar36;
  local_1088._12_4_ = iVar36;
  auVar113 = ZEXT1664(local_1088);
  local_11a0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1074 = local_1078;
  fStack_1070 = local_1078;
  fStack_106c = local_1078;
  uVar43 = local_1198;
  fVar48 = local_1058;
  fVar56 = local_1058;
  fVar57 = local_1058;
  fVar58 = local_1058;
  fVar84 = local_1068;
  fVar99 = local_1068;
  fVar101 = local_1068;
  fVar103 = local_1068;
  fVar105 = local_1078;
  fVar108 = local_1078;
  fVar109 = local_1078;
  fVar110 = local_1078;
  do {
    do {
      do {
        if (pSVar45 == stack) {
          return;
        }
        pSVar34 = pSVar45 + -1;
        pSVar45 = pSVar45 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar34->dist);
      sVar40 = (pSVar45->ptr).ptr;
      do {
        if ((sVar40 & 8) == 0) {
          auVar60 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + uVar44),auVar87._0_16_);
          auVar59._0_4_ = fVar48 * auVar60._0_4_;
          auVar59._4_4_ = fVar56 * auVar60._4_4_;
          auVar59._8_4_ = fVar57 * auVar60._8_4_;
          auVar59._12_4_ = fVar58 * auVar60._12_4_;
          auVar60 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + uVar43),auVar90._0_16_);
          auVar72._0_4_ = fVar84 * auVar60._0_4_;
          auVar72._4_4_ = fVar99 * auVar60._4_4_;
          auVar72._8_4_ = fVar101 * auVar60._8_4_;
          auVar72._12_4_ = fVar103 * auVar60._12_4_;
          auVar60 = vpmaxsd_avx(auVar59,auVar72);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + uVar41),auVar94._0_16_);
          auVar73._0_4_ = fVar105 * auVar59._0_4_;
          auVar73._4_4_ = fVar108 * auVar59._4_4_;
          auVar73._8_4_ = fVar109 * auVar59._8_4_;
          auVar73._12_4_ = fVar110 * auVar59._12_4_;
          auVar59 = vpmaxsd_avx(auVar73,auVar113._0_16_);
          tNear.field_0 =
               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar60,auVar59);
          auVar60 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + (uVar44 ^ 0x10)),
                               auVar87._0_16_);
          auVar74._0_4_ = fVar48 * auVar60._0_4_;
          auVar74._4_4_ = fVar56 * auVar60._4_4_;
          auVar74._8_4_ = fVar57 * auVar60._8_4_;
          auVar74._12_4_ = fVar58 * auVar60._12_4_;
          auVar60 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + uVar47),auVar90._0_16_);
          auVar81._0_4_ = fVar84 * auVar60._0_4_;
          auVar81._4_4_ = fVar99 * auVar60._4_4_;
          auVar81._8_4_ = fVar101 * auVar60._8_4_;
          auVar81._12_4_ = fVar103 * auVar60._12_4_;
          auVar60 = vpminsd_avx(auVar74,auVar81);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + local_1190),auVar94._0_16_);
          auVar82._0_4_ = fVar105 * auVar59._0_4_;
          auVar82._4_4_ = fVar108 * auVar59._4_4_;
          auVar82._8_4_ = fVar109 * auVar59._8_4_;
          auVar82._12_4_ = fVar110 * auVar59._12_4_;
          auVar59 = vpminsd_avx(auVar82,auVar55._0_16_);
          auVar60 = vpminsd_avx(auVar60,auVar59);
          auVar60 = vpcmpgtd_avx((undefined1  [16])tNear.field_0,auVar60);
          uVar35 = vmovmskps_avx(auVar60);
          unaff_R13 = ((ulong)uVar35 ^ 0xf) & 0xff;
        }
        if ((sVar40 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar36 = 4;
          }
          else {
            uVar39 = sVar40 & 0xfffffffffffffff0;
            lVar46 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
              }
            }
            iVar36 = 0;
            sVar40 = *(ulong *)(uVar39 + lVar46 * 8);
            uVar42 = unaff_R13 - 1 & unaff_R13;
            if (uVar42 != 0) {
              uVar35 = tNear.field_0.i[lVar46];
              lVar46 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              uVar2 = *(ulong *)(uVar39 + lVar46 * 8);
              uVar95 = tNear.field_0.i[lVar46];
              uVar42 = uVar42 - 1 & uVar42;
              if (uVar42 == 0) {
                if (uVar35 < uVar95) {
                  (pSVar45->ptr).ptr = uVar2;
                  pSVar45->dist = uVar95;
                  pSVar45 = pSVar45 + 1;
                }
                else {
                  (pSVar45->ptr).ptr = sVar40;
                  pSVar45->dist = uVar35;
                  sVar40 = uVar2;
                  pSVar45 = pSVar45 + 1;
                }
              }
              else {
                auVar60._8_8_ = 0;
                auVar60._0_8_ = sVar40;
                auVar60 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar35));
                auVar75._8_8_ = 0;
                auVar75._0_8_ = uVar2;
                auVar59 = vpunpcklqdq_avx(auVar75,ZEXT416(uVar95));
                lVar46 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                  }
                }
                auVar83._8_8_ = 0;
                auVar83._0_8_ = *(ulong *)(uVar39 + lVar46 * 8);
                auVar73 = vpunpcklqdq_avx(auVar83,ZEXT416((uint)tNear.field_0.i[lVar46]));
                auVar72 = vpcmpgtd_avx(auVar59,auVar60);
                uVar42 = uVar42 - 1 & uVar42;
                if (uVar42 == 0) {
                  auVar74 = vpshufd_avx(auVar72,0xaa);
                  auVar72 = vblendvps_avx(auVar59,auVar60,auVar74);
                  auVar60 = vblendvps_avx(auVar60,auVar59,auVar74);
                  auVar59 = vpcmpgtd_avx(auVar73,auVar72);
                  auVar74 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar73,auVar72,auVar74);
                  auVar72 = vblendvps_avx(auVar72,auVar73,auVar74);
                  auVar73 = vpcmpgtd_avx(auVar72,auVar60);
                  auVar73 = vpshufd_avx(auVar73,0xaa);
                  SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar72,auVar60,auVar73);
                  SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar60,auVar72,auVar73);
                  *pSVar45 = SVar11;
                  pSVar45[1] = SVar10;
                  sVar40 = auVar59._0_8_;
                  pSVar45 = pSVar45 + 2;
                }
                else {
                  lVar46 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                    }
                  }
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = *(ulong *)(uVar39 + lVar46 * 8);
                  auVar81 = vpunpcklqdq_avx(auVar85,ZEXT416((uint)tNear.field_0.i[lVar46]));
                  auVar74 = vpshufd_avx(auVar72,0xaa);
                  auVar72 = vblendvps_avx(auVar59,auVar60,auVar74);
                  auVar60 = vblendvps_avx(auVar60,auVar59,auVar74);
                  auVar59 = vpcmpgtd_avx(auVar81,auVar73);
                  auVar74 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar81,auVar73,auVar74);
                  auVar73 = vblendvps_avx(auVar73,auVar81,auVar74);
                  auVar74 = vpcmpgtd_avx(auVar73,auVar60);
                  auVar81 = vpshufd_avx(auVar74,0xaa);
                  auVar74 = vblendvps_avx(auVar73,auVar60,auVar81);
                  SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar60,auVar73,auVar81);
                  auVar60 = vpcmpgtd_avx(auVar59,auVar72);
                  auVar73 = vpshufd_avx(auVar60,0xaa);
                  auVar60 = vblendvps_avx(auVar59,auVar72,auVar73);
                  auVar59 = vblendvps_avx(auVar72,auVar59,auVar73);
                  auVar72 = vpcmpgtd_avx(auVar74,auVar59);
                  auVar72 = vpshufd_avx(auVar72,0xaa);
                  SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar74,auVar59,auVar72);
                  SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar59,auVar74,auVar72);
                  *pSVar45 = SVar10;
                  pSVar45[1] = SVar12;
                  pSVar45[2] = SVar11;
                  sVar40 = auVar60._0_8_;
                  pSVar45 = pSVar45 + 3;
                }
              }
            }
          }
        }
        else {
          iVar36 = 6;
        }
      } while (iVar36 == 0);
    } while (iVar36 != 6);
    uVar43 = (ulong)((uint)sVar40 & 0xf);
    if (uVar43 != 8) {
      uVar39 = sVar40 & 0xfffffffffffffff0;
      lVar46 = 0;
      do {
        lVar38 = lVar46 * 0x50;
        pSVar3 = context->scene;
        ppfVar4 = (pSVar3->vertices).items;
        pfVar5 = ppfVar4[*(uint *)(uVar39 + 0x30 + lVar38)];
        pfVar6 = ppfVar4[*(uint *)(uVar39 + 0x34 + lVar38)];
        pfVar7 = ppfVar4[*(uint *)(uVar39 + 0x38 + lVar38)];
        pfVar8 = ppfVar4[*(uint *)(uVar39 + 0x3c + lVar38)];
        auVar72 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + lVar38)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 8 + lVar38)));
        auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + lVar38)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 8 + lVar38)));
        auVar73 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 4 + lVar38)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0xc + lVar38)));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 4 + lVar38)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0xc + lVar38)));
        auVar75 = vunpcklps_avx(auVar60,auVar59);
        auVar83 = vunpcklps_avx(auVar72,auVar73);
        auVar82 = vunpckhps_avx(auVar72,auVar73);
        auVar72 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x10 + lVar38)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x18 + lVar38)));
        auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x10 + lVar38)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x18 + lVar38)));
        auVar73 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x14 + lVar38)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x1c + lVar38)));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x14 + lVar38)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x1c + lVar38)));
        auVar81 = vunpcklps_avx(auVar60,auVar59);
        auVar85 = vunpcklps_avx(auVar72,auVar73);
        auVar59 = vunpckhps_avx(auVar72,auVar73);
        auVar73 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x20 + lVar38)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x28 + lVar38)));
        auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar39 + 0x20 + lVar38)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar39 + 0x28 + lVar38)));
        auVar74 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x24 + lVar38)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x2c + lVar38)));
        auVar72 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar39 + 0x24 + lVar38)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x2c + lVar38)));
        auVar49 = vunpcklps_avx(auVar60,auVar72);
        auVar50 = vunpcklps_avx(auVar73,auVar74);
        auVar74 = vunpckhps_avx(auVar73,auVar74);
        puVar1 = (undefined8 *)(uVar39 + 0x30 + lVar38);
        local_1018 = *puVar1;
        uStack_1010 = puVar1[1];
        puVar1 = (undefined8 *)(uVar39 + 0x40 + lVar38);
        local_1158 = *puVar1;
        uStack_1150 = puVar1[1];
        auVar60 = vsubps_avx(auVar83,auVar85);
        auVar59 = vsubps_avx(auVar82,auVar59);
        auVar72 = vsubps_avx(auVar75,auVar81);
        auVar73 = vsubps_avx(auVar50,auVar83);
        auVar74 = vsubps_avx(auVar74,auVar82);
        auVar81 = vsubps_avx(auVar49,auVar75);
        fVar58 = auVar59._0_4_;
        fVar98 = auVar81._0_4_;
        auVar49._0_4_ = fVar98 * fVar58;
        fVar109 = auVar59._4_4_;
        fVar100 = auVar81._4_4_;
        auVar49._4_4_ = fVar100 * fVar109;
        fVar18 = auVar59._8_4_;
        fVar102 = auVar81._8_4_;
        auVar49._8_4_ = fVar102 * fVar18;
        fVar25 = auVar59._12_4_;
        fVar104 = auVar81._12_4_;
        auVar49._12_4_ = fVar104 * fVar25;
        fVar84 = auVar74._0_4_;
        fVar88 = auVar72._0_4_;
        auVar61._0_4_ = fVar88 * fVar84;
        fVar110 = auVar74._4_4_;
        fVar91 = auVar72._4_4_;
        auVar61._4_4_ = fVar91 * fVar110;
        fVar19 = auVar74._8_4_;
        fVar92 = auVar72._8_4_;
        auVar61._8_4_ = fVar92 * fVar19;
        fVar26 = auVar74._12_4_;
        fVar93 = auVar72._12_4_;
        auVar61._12_4_ = fVar93 * fVar26;
        local_10b8 = vsubps_avx(auVar61,auVar49);
        fVar99 = auVar73._0_4_;
        auVar62._0_4_ = fVar88 * fVar99;
        fVar13 = auVar73._4_4_;
        auVar62._4_4_ = fVar91 * fVar13;
        fVar20 = auVar73._8_4_;
        auVar62._8_4_ = fVar92 * fVar20;
        fVar27 = auVar73._12_4_;
        auVar62._12_4_ = fVar93 * fVar27;
        fVar101 = auVar60._0_4_;
        auVar76._0_4_ = fVar98 * fVar101;
        fVar14 = auVar60._4_4_;
        auVar76._4_4_ = fVar100 * fVar14;
        fVar21 = auVar60._8_4_;
        auVar76._8_4_ = fVar102 * fVar21;
        fVar28 = auVar60._12_4_;
        auVar76._12_4_ = fVar104 * fVar28;
        local_10a8 = vsubps_avx(auVar76,auVar62);
        auVar77._0_4_ = fVar84 * fVar101;
        auVar77._4_4_ = fVar110 * fVar14;
        auVar77._8_4_ = fVar19 * fVar21;
        auVar77._12_4_ = fVar26 * fVar28;
        auVar106._0_4_ = fVar99 * fVar58;
        auVar106._4_4_ = fVar13 * fVar109;
        auVar106._8_4_ = fVar20 * fVar18;
        auVar106._12_4_ = fVar27 * fVar25;
        auVar73 = vsubps_avx(auVar106,auVar77);
        uVar37 = *(undefined4 *)(ray + k * 4);
        auVar107._4_4_ = uVar37;
        auVar107._0_4_ = uVar37;
        auVar107._8_4_ = uVar37;
        auVar107._12_4_ = uVar37;
        uVar37 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar111._4_4_ = uVar37;
        auVar111._0_4_ = uVar37;
        auVar111._8_4_ = uVar37;
        auVar111._12_4_ = uVar37;
        uVar37 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar114._4_4_ = uVar37;
        auVar114._0_4_ = uVar37;
        auVar114._8_4_ = uVar37;
        auVar114._12_4_ = uVar37;
        fVar48 = *(float *)(ray + k * 4 + 0x50);
        auVar60 = vsubps_avx(auVar83,auVar107);
        fVar56 = *(float *)(ray + k * 4 + 0x60);
        auVar59 = vsubps_avx(auVar82,auVar111);
        auVar72 = vsubps_avx(auVar75,auVar114);
        fVar103 = auVar72._0_4_;
        auVar112._0_4_ = fVar48 * fVar103;
        fVar15 = auVar72._4_4_;
        auVar112._4_4_ = fVar48 * fVar15;
        fVar22 = auVar72._8_4_;
        auVar112._8_4_ = fVar48 * fVar22;
        fVar29 = auVar72._12_4_;
        auVar112._12_4_ = fVar48 * fVar29;
        fVar105 = auVar59._0_4_;
        auVar115._0_4_ = fVar56 * fVar105;
        fVar16 = auVar59._4_4_;
        auVar115._4_4_ = fVar56 * fVar16;
        fVar23 = auVar59._8_4_;
        auVar115._8_4_ = fVar56 * fVar23;
        fVar30 = auVar59._12_4_;
        auVar115._12_4_ = fVar56 * fVar30;
        auVar59 = vsubps_avx(auVar115,auVar112);
        fVar57 = *(float *)(ray + k * 4 + 0x40);
        fVar108 = auVar60._0_4_;
        auVar50._0_4_ = fVar56 * fVar108;
        fVar17 = auVar60._4_4_;
        auVar50._4_4_ = fVar56 * fVar17;
        fVar24 = auVar60._8_4_;
        auVar50._8_4_ = fVar56 * fVar24;
        fVar31 = auVar60._12_4_;
        auVar50._12_4_ = fVar56 * fVar31;
        auVar63._0_4_ = fVar57 * fVar103;
        auVar63._4_4_ = fVar57 * fVar15;
        auVar63._8_4_ = fVar57 * fVar22;
        auVar63._12_4_ = fVar57 * fVar29;
        auVar72 = vsubps_avx(auVar63,auVar50);
        auVar64._0_4_ = fVar57 * fVar105;
        auVar64._4_4_ = fVar57 * fVar16;
        auVar64._8_4_ = fVar57 * fVar23;
        auVar64._12_4_ = fVar57 * fVar30;
        auVar78._0_4_ = fVar48 * fVar108;
        auVar78._4_4_ = fVar48 * fVar17;
        auVar78._8_4_ = fVar48 * fVar24;
        auVar78._12_4_ = fVar48 * fVar31;
        auVar74 = vsubps_avx(auVar78,auVar64);
        auVar79._0_4_ =
             fVar57 * local_10b8._0_4_ + fVar48 * local_10a8._0_4_ + fVar56 * auVar73._0_4_;
        auVar79._4_4_ =
             fVar57 * local_10b8._4_4_ + fVar48 * local_10a8._4_4_ + fVar56 * auVar73._4_4_;
        auVar79._8_4_ =
             fVar57 * local_10b8._8_4_ + fVar48 * local_10a8._8_4_ + fVar56 * auVar73._8_4_;
        auVar79._12_4_ =
             fVar57 * local_10b8._12_4_ + fVar48 * local_10a8._12_4_ + fVar56 * auVar73._12_4_;
        auVar65._8_4_ = 0x80000000;
        auVar65._0_8_ = 0x8000000080000000;
        auVar65._12_4_ = 0x80000000;
        auVar60 = vandps_avx(auVar79,auVar65);
        uVar35 = auVar60._0_4_;
        tNear.field_0._0_4_ =
             (float)(uVar35 ^ (uint)(fVar99 * auVar59._0_4_ +
                                    fVar98 * auVar74._0_4_ + fVar84 * auVar72._0_4_));
        uVar95 = auVar60._4_4_;
        tNear.field_0._4_4_ =
             (float)(uVar95 ^ (uint)(fVar13 * auVar59._4_4_ +
                                    fVar100 * auVar74._4_4_ + fVar110 * auVar72._4_4_));
        uVar96 = auVar60._8_4_;
        tNear.field_0._8_4_ =
             (float)(uVar96 ^ (uint)(fVar20 * auVar59._8_4_ +
                                    fVar102 * auVar74._8_4_ + fVar19 * auVar72._8_4_));
        uVar97 = auVar60._12_4_;
        tNear.field_0._12_4_ =
             (float)(uVar97 ^ (uint)(fVar27 * auVar59._12_4_ +
                                    fVar104 * auVar74._12_4_ + fVar26 * auVar72._12_4_));
        auVar89._0_4_ =
             (float)(uVar35 ^ (uint)(auVar59._0_4_ * fVar101 +
                                    fVar88 * auVar74._0_4_ + fVar58 * auVar72._0_4_));
        auVar89._4_4_ =
             (float)(uVar95 ^ (uint)(auVar59._4_4_ * fVar14 +
                                    fVar91 * auVar74._4_4_ + fVar109 * auVar72._4_4_));
        auVar89._8_4_ =
             (float)(uVar96 ^ (uint)(auVar59._8_4_ * fVar21 +
                                    fVar92 * auVar74._8_4_ + fVar18 * auVar72._8_4_));
        auVar89._12_4_ =
             (float)(uVar97 ^ (uint)(auVar59._12_4_ * fVar28 +
                                    fVar93 * auVar74._12_4_ + fVar25 * auVar72._12_4_));
        auVar72 = ZEXT416(0) << 0x20;
        auVar60 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar72,5);
        auVar59 = vcmpps_avx(auVar89,auVar72,5);
        auVar60 = vandps_avx(auVar60,auVar59);
        auVar66._8_4_ = 0x7fffffff;
        auVar66._0_8_ = 0x7fffffff7fffffff;
        auVar66._12_4_ = 0x7fffffff;
        auVar59 = vandps_avx(auVar79,auVar66);
        auVar72 = vcmpps_avx(auVar72,auVar79,4);
        auVar60 = vandps_avx(auVar60,auVar72);
        auVar51._0_4_ = auVar89._0_4_ + tNear.field_0._0_4_;
        auVar51._4_4_ = auVar89._4_4_ + tNear.field_0._4_4_;
        auVar51._8_4_ = auVar89._8_4_ + tNear.field_0._8_4_;
        auVar51._12_4_ = auVar89._12_4_ + tNear.field_0._12_4_;
        auVar72 = vcmpps_avx(auVar51,auVar59,2);
        auVar74 = auVar72 & auVar60;
        if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar74[0xf] < '\0') {
          auVar60 = vandps_avx(auVar60,auVar72);
          auVar86._0_4_ =
               (float)(uVar35 ^ (uint)(local_10b8._0_4_ * fVar108 +
                                      local_10a8._0_4_ * fVar105 + fVar103 * auVar73._0_4_));
          auVar86._4_4_ =
               (float)(uVar95 ^ (uint)(local_10b8._4_4_ * fVar17 +
                                      local_10a8._4_4_ * fVar16 + fVar15 * auVar73._4_4_));
          auVar86._8_4_ =
               (float)(uVar96 ^ (uint)(local_10b8._8_4_ * fVar24 +
                                      local_10a8._8_4_ * fVar23 + fVar22 * auVar73._8_4_));
          auVar86._12_4_ =
               (float)(uVar97 ^ (uint)(local_10b8._12_4_ * fVar31 +
                                      local_10a8._12_4_ * fVar30 + fVar29 * auVar73._12_4_));
          fVar48 = *(float *)(ray + k * 4 + 0x30);
          fVar56 = auVar59._0_4_;
          auVar52._0_4_ = fVar56 * fVar48;
          fVar57 = auVar59._4_4_;
          auVar52._4_4_ = fVar57 * fVar48;
          fVar58 = auVar59._8_4_;
          auVar52._8_4_ = fVar58 * fVar48;
          fVar84 = auVar59._12_4_;
          auVar52._12_4_ = fVar84 * fVar48;
          auVar72 = vcmpps_avx(auVar52,auVar86,1);
          fVar48 = *(float *)(ray + k * 4 + 0x80);
          auVar67._0_4_ = fVar56 * fVar48;
          auVar67._4_4_ = fVar57 * fVar48;
          auVar67._8_4_ = fVar58 * fVar48;
          auVar67._12_4_ = fVar84 * fVar48;
          auVar74 = vcmpps_avx(auVar86,auVar67,2);
          auVar72 = vandps_avx(auVar72,auVar74);
          auVar74 = auVar60 & auVar72;
          if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar74[0xf] < '\0') {
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar60,auVar72);
            local_1218 = auVar73._0_8_;
            uStack_1210 = auVar73._8_8_;
            local_1098 = local_1218;
            uStack_1090 = uStack_1210;
            auVar60 = vrcpps_avx(auVar59);
            fVar48 = auVar60._0_4_;
            auVar68._0_4_ = fVar56 * fVar48;
            fVar56 = auVar60._4_4_;
            auVar68._4_4_ = fVar57 * fVar56;
            fVar57 = auVar60._8_4_;
            auVar68._8_4_ = fVar58 * fVar57;
            fVar58 = auVar60._12_4_;
            auVar68._12_4_ = fVar84 * fVar58;
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = &DAT_3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar60 = vsubps_avx(auVar80,auVar68);
            fVar48 = fVar48 + fVar48 * auVar60._0_4_;
            fVar56 = fVar56 + fVar56 * auVar60._4_4_;
            fVar57 = fVar57 + fVar57 * auVar60._8_4_;
            fVar58 = fVar58 + fVar58 * auVar60._12_4_;
            local_10c8._0_4_ = fVar48 * auVar86._0_4_;
            local_10c8._4_4_ = fVar56 * auVar86._4_4_;
            local_10c8._8_4_ = fVar57 * auVar86._8_4_;
            local_10c8._12_4_ = fVar58 * auVar86._12_4_;
            auVar55 = ZEXT1664(local_10c8);
            local_10e8[0] = fVar48 * tNear.field_0._0_4_;
            local_10e8[1] = fVar56 * tNear.field_0._4_4_;
            local_10e8[2] = fVar57 * tNear.field_0._8_4_;
            local_10e8[3] = fVar58 * tNear.field_0._12_4_;
            auVar69._8_4_ = 0x7f800000;
            auVar69._0_8_ = 0x7f8000007f800000;
            auVar69._12_4_ = 0x7f800000;
            auVar60 = vblendvps_avx(auVar69,local_10c8,(undefined1  [16])valid.field_0);
            local_10d8[0] = fVar48 * auVar89._0_4_;
            local_10d8[1] = fVar56 * auVar89._4_4_;
            local_10d8[2] = fVar57 * auVar89._8_4_;
            local_10d8[3] = fVar58 * auVar89._12_4_;
            auVar59 = vshufps_avx(auVar60,auVar60,0xb1);
            auVar59 = vminps_avx(auVar59,auVar60);
            auVar72 = vshufpd_avx(auVar59,auVar59,1);
            auVar59 = vminps_avx(auVar72,auVar59);
            auVar59 = vcmpps_avx(auVar60,auVar59,0);
            auVar72 = (undefined1  [16])valid.field_0 & auVar59;
            auVar60 = vpcmpeqd_avx(auVar60,auVar60);
            if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar72[0xf] < '\0') {
              auVar60 = auVar59;
            }
            auVar60 = vandps_avx((undefined1  [16])valid.field_0,auVar60);
            uVar37 = vmovmskps_avx(auVar60);
            uVar42 = CONCAT44((int)((ulong)lVar38 >> 0x20),uVar37);
            local_11a8 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> local_11a8 & 1) == 0; local_11a8 = local_11a8 + 1) {
              }
            }
LAB_003439ee:
            uVar35 = *(uint *)((long)&local_1018 + local_11a8 * 4);
            uVar42 = (ulong)uVar35;
            local_11b0 = (pSVar3->geometries).items[uVar42].ptr;
            if ((local_11b0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[local_11a8] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_11b0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar48 = local_10e8[local_11a8];
                fVar56 = local_10d8[local_11a8];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c8 + local_11a8 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10b8 + local_11a8 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10a8 + local_11a8 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)((long)&local_1098 + local_11a8 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar48;
                *(float *)(ray + k * 4 + 0x100) = fVar56;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_1158 + local_11a8 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar35;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0034389e;
              }
              auVar60 = auVar55._0_16_;
              fVar48 = local_10e8[local_11a8];
              h.u.field_0.i[1] = (int)fVar48;
              h.u.field_0.i[0] = (int)fVar48;
              h.u.field_0.i[2] = (int)fVar48;
              h.u.field_0.i[3] = (int)fVar48;
              h.v.field_0.v[0] = local_10d8[local_11a8];
              h.geomID.field_0 =
                   (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpshufd_avx(ZEXT416(uVar35),0);
              uVar37 = *(undefined4 *)((long)&local_1158 + local_11a8 * 4);
              h.primID.field_0.i[1] = uVar37;
              h.primID.field_0.i[0] = uVar37;
              h.primID.field_0.i[2] = uVar37;
              h.primID.field_0.i[3] = uVar37;
              uVar37 = *(undefined4 *)(local_10b8 + local_11a8 * 4);
              h.Ng.field_0._4_4_ = uVar37;
              h.Ng.field_0._0_4_ = uVar37;
              h.Ng.field_0._8_4_ = uVar37;
              h.Ng.field_0._12_4_ = uVar37;
              h.Ng.field_0._16_4_ = *(undefined4 *)(local_10a8 + local_11a8 * 4);
              uVar37 = *(undefined4 *)((long)&local_1098 + local_11a8 * 4);
              h.Ng.field_0._36_4_ = uVar37;
              h.Ng.field_0._32_4_ = uVar37;
              h.Ng.field_0._40_4_ = uVar37;
              h.Ng.field_0._44_4_ = uVar37;
              h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
              h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
              h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
              h.v.field_0.v[1] = h.v.field_0.v[0];
              h.v.field_0.v[2] = h.v.field_0.v[0];
              h.v.field_0.v[3] = h.v.field_0.v[0];
              vcmpps_avx(ZEXT1632((undefined1  [16])h.u.field_0),
                         ZEXT1632((undefined1  [16])h.u.field_0),0xf);
              h.instID[0].field_0.i[1] = context->user->instID[0];
              h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
              h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
              h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
              h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
              h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
              uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c8 + local_11a8 * 4);
              local_11c8 = *local_11a0;
              uStack_11c0 = local_11a0[1];
              args.valid = (int *)&local_11c8;
              args.geometryUserPtr = local_11b0->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&h;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (local_11b0->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_11b0->intersectionFilterN)(&args);
              }
              auVar32._8_8_ = uStack_11c0;
              auVar32._0_8_ = local_11c8;
              if (auVar32 == (undefined1  [16])0x0) {
                auVar59 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar59 = auVar59 ^ _DAT_01febe20;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_11b0->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var9)(&args);
                }
                auVar33._8_8_ = uStack_11c0;
                auVar33._0_8_ = local_11c8;
                auVar72 = vpcmpeqd_avx(auVar33,_DAT_01feba10);
                auVar59 = auVar72 ^ _DAT_01febe20;
                if (auVar33 != (undefined1  [16])0x0) {
                  auVar72 = auVar72 ^ _DAT_01febe20;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar73;
                  auVar72 = vmaskmovps_avx(auVar72,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar72;
                }
              }
              auVar71._8_8_ = 0x100000001;
              auVar71._0_8_ = 0x100000001;
              if ((auVar71 & auVar59) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar37;
              }
              valid.field_0.v[local_11a8] = 0.0;
              uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar54._4_4_ = uVar37;
              auVar54._0_4_ = uVar37;
              auVar54._8_4_ = uVar37;
              auVar54._12_4_ = uVar37;
              auVar55 = ZEXT1664(auVar60);
              auVar60 = vcmpps_avx(auVar60,auVar54,2);
              valid.field_0 =
                   (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                   vandps_avx(auVar60,(undefined1  [16])valid.field_0);
              uVar42 = local_11a8;
            }
            if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0 &&
                 ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                 (undefined1  [16])0x0) &&
                ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) goto LAB_0034389e;
            auVar70._8_4_ = 0x7f800000;
            auVar70._0_8_ = 0x7f8000007f800000;
            auVar70._12_4_ = 0x7f800000;
            auVar60 = vblendvps_avx(auVar70,auVar55._0_16_,(undefined1  [16])valid.field_0);
            auVar59 = vshufps_avx(auVar60,auVar60,0xb1);
            auVar59 = vminps_avx(auVar59,auVar60);
            auVar72 = vshufpd_avx(auVar59,auVar59,1);
            auVar59 = vminps_avx(auVar72,auVar59);
            auVar60 = vcmpps_avx(auVar60,auVar59,0);
            auVar59 = (undefined1  [16])valid.field_0 & auVar60;
            aVar53 = valid.field_0;
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              aVar53.v = (__m128)vandps_avx(auVar60,valid.field_0);
            }
            uVar37 = vmovmskps_avx((undefined1  [16])aVar53);
            uVar42 = CONCAT44((int)(uVar42 >> 0x20),uVar37);
            local_11a8 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> local_11a8 & 1) == 0; local_11a8 = local_11a8 + 1) {
              }
            }
            goto LAB_003439ee;
          }
        }
LAB_0034389e:
        lVar46 = lVar46 + 1;
      } while (lVar46 != uVar43 - 8);
    }
    uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar55 = ZEXT1664(CONCAT412(uVar37,CONCAT48(uVar37,CONCAT44(uVar37,uVar37))));
    auVar87 = ZEXT1664(local_1028);
    auVar90 = ZEXT1664(local_1038);
    auVar94 = ZEXT1664(local_1048);
    auVar113 = ZEXT1664(local_1088);
    uVar43 = local_1198;
    fVar48 = local_1058;
    fVar56 = fStack_1054;
    fVar57 = fStack_1050;
    fVar58 = fStack_104c;
    fVar84 = local_1068;
    fVar99 = fStack_1064;
    fVar101 = fStack_1060;
    fVar103 = fStack_105c;
    fVar105 = local_1078;
    fVar108 = fStack_1074;
    fVar109 = fStack_1070;
    fVar110 = fStack_106c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }